

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O3

void __thiscall TasGrid::GridWavelet::loadGpuCoefficients<double>(GridWavelet *this)

{
  double *pdVar1;
  CudaWaveletData<double> *this_00;
  
  this_00 = (this->gpu_cache)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
            .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl;
  if (this_00 == (CudaWaveletData<double> *)0x0) {
    this_00 = (CudaWaveletData<double> *)operator_new(0x30);
    (this_00->coefficients).num_entries = 0;
    (this_00->coefficients).gpu_data = (double *)0x0;
    (this_00->nodes).num_entries = 0;
    (this_00->nodes).gpu_data = (double *)0x0;
    (this_00->support).num_entries = 0;
    (this_00->support).gpu_data = (double *)0x0;
    (this->gpu_cache)._M_t.
    super___uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl = this_00;
  }
  else if ((this_00->coefficients).num_entries != 0) {
    return;
  }
  pdVar1 = (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  GpuVector<double>::load
            (&this_00->coefficients,(this->super_BaseCanonicalGrid).acceleration,
             (long)(this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3,pdVar1);
  return;
}

Assistant:

void GridWavelet::loadGpuCoefficients() const{
    auto &ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaWaveletData<T>>();
    if (ccache->coefficients.empty()) ccache->coefficients.load(acceleration, coefficients.begin(), coefficients.end());
}